

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
 __thiscall
google::protobuf::compiler::anon_unknown_5::PopulateSingleSimpleDescriptorDatabase
          (anon_unknown_5 *this,string *descriptor_set_name)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  int *piVar5;
  ostream *poVar6;
  SimpleDescriptorDatabase *this_00;
  pointer pSVar7;
  FileDescriptorProto *pFVar8;
  string *psVar9;
  bool bVar10;
  undefined1 local_188 [8];
  FileDescriptorProto previously_added_file_descriptor_proto;
  int j;
  unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
  database;
  undefined1 local_68 [7];
  bool parsed;
  FileDescriptorSet file_descriptor_set;
  int fd;
  string *descriptor_set_name_local;
  
  do {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    file_descriptor_set.field_0._52_4_ = open(pcVar4,0);
    bVar10 = false;
    if ((int)file_descriptor_set.field_0._52_4_ < 0) {
      piVar5 = __errno_location();
      bVar10 = *piVar5 == 4;
    }
  } while (bVar10);
  if ((int)file_descriptor_set.field_0._52_4_ < 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,(string *)descriptor_set_name);
    poVar6 = std::operator<<(poVar6,": ");
    pcVar4 = strerror(2);
    poVar6 = std::operator<<(poVar6,pcVar4);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::
    unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>
    ::unique_ptr<std::default_delete<google::protobuf::SimpleDescriptorDatabase>,void>
              ((unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>
                *)this,(nullptr_t)0x0);
  }
  else {
    FileDescriptorSet::FileDescriptorSet((FileDescriptorSet *)local_68);
    bVar10 = MessageLite::ParseFromFileDescriptor
                       ((MessageLite *)local_68,file_descriptor_set.field_0._52_4_);
    iVar2 = close(file_descriptor_set.field_0._52_4_);
    if (iVar2 == 0) {
      if (bVar10) {
        this_00 = (SimpleDescriptorDatabase *)operator_new(0x68);
        SimpleDescriptorDatabase::SimpleDescriptorDatabase(this_00);
        std::
        unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>
        ::unique_ptr<std::default_delete<google::protobuf::SimpleDescriptorDatabase>,void>
                  ((unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>
                    *)&stack0xffffffffffffff78,this_00);
        for (previously_added_file_descriptor_proto.field_0._228_4_ = 0;
            uVar1 = previously_added_file_descriptor_proto.field_0._228_4_,
            iVar2 = FileDescriptorSet::file_size((FileDescriptorSet *)local_68), (int)uVar1 < iVar2;
            previously_added_file_descriptor_proto.field_0._228_4_ =
                 previously_added_file_descriptor_proto.field_0._228_4_ + 1) {
          FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_188);
          pSVar7 = std::
                   unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
                   ::operator->((unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
                                 *)&stack0xffffffffffffff78);
          pFVar8 = FileDescriptorSet::file
                             ((FileDescriptorSet *)local_68,
                              previously_added_file_descriptor_proto.field_0._228_4_);
          psVar9 = FileDescriptorProto::name_abi_cxx11_(pFVar8);
          uVar3 = (*(pSVar7->super_DescriptorDatabase)._vptr_DescriptorDatabase[2])
                            (pSVar7,psVar9,local_188);
          if ((uVar3 & 1) == 0) {
            pSVar7 = std::
                     unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
                     ::operator->((unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
                                   *)&stack0xffffffffffffff78);
            pFVar8 = FileDescriptorSet::file
                               ((FileDescriptorSet *)local_68,
                                previously_added_file_descriptor_proto.field_0._228_4_);
            bVar10 = SimpleDescriptorDatabase::Add(pSVar7,pFVar8);
            if (bVar10) {
              database._M_t.
              super___uniq_ptr_impl<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
              ._M_t.
              super__Tuple_impl<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
              .super__Head_base<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_false>.
              _M_head_impl._0_4_ = 0;
            }
            else {
              std::
              unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>
              ::unique_ptr<std::default_delete<google::protobuf::SimpleDescriptorDatabase>,void>
                        ((unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>
                          *)this,(nullptr_t)0x0);
              database._M_t.
              super___uniq_ptr_impl<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
              ._M_t.
              super__Tuple_impl<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
              .super__Head_base<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_false>.
              _M_head_impl._0_4_ = 1;
            }
          }
          else {
            database._M_t.
            super___uniq_ptr_impl<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
            ._M_t.
            super__Tuple_impl<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
            .super__Head_base<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_false>._M_head_impl
            ._0_4_ = 6;
          }
          FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_188);
          if (((int)database._M_t.
                    super___uniq_ptr_impl<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
                    .super__Head_base<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_false>.
                    _M_head_impl != 0) &&
             ((int)database._M_t.
                   super___uniq_ptr_impl<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
                   .super__Head_base<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_false>.
                   _M_head_impl != 6)) goto LAB_0024e4ef;
        }
        std::
        unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
        ::unique_ptr((unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
                      *)this,(unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
                              *)&stack0xffffffffffffff78);
        database._M_t.
        super___uniq_ptr_impl<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
        .super__Head_base<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_false>._M_head_impl.
        _0_4_ = 1;
LAB_0024e4ef:
        std::
        unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
        ::~unique_ptr((unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
                       *)&stack0xffffffffffffff78);
      }
      else {
        poVar6 = std::operator<<((ostream *)&std::cerr,(string *)descriptor_set_name);
        poVar6 = std::operator<<(poVar6,": Unable to parse.");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::
        unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>
        ::unique_ptr<std::default_delete<google::protobuf::SimpleDescriptorDatabase>,void>
                  ((unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>
                    *)this,(nullptr_t)0x0);
        database._M_t.
        super___uniq_ptr_impl<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
        .super__Head_base<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_false>._M_head_impl.
        _0_4_ = 1;
      }
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cerr,(string *)descriptor_set_name);
      poVar6 = std::operator<<(poVar6,": close: ");
      piVar5 = __errno_location();
      pcVar4 = strerror(*piVar5);
      poVar6 = std::operator<<(poVar6,pcVar4);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::
      unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>
      ::unique_ptr<std::default_delete<google::protobuf::SimpleDescriptorDatabase>,void>
                ((unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>
                  *)this,(nullptr_t)0x0);
      database._M_t.
      super___uniq_ptr_impl<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
      .super__Head_base<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_false>._M_head_impl._0_4_
           = 1;
    }
    FileDescriptorSet::~FileDescriptorSet((FileDescriptorSet *)local_68);
  }
  return (__uniq_ptr_data<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>,_true,_true>
          )(__uniq_ptr_data<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<SimpleDescriptorDatabase>
PopulateSingleSimpleDescriptorDatabase(const std::string& descriptor_set_name) {
  int fd;
  do {
    fd = open(descriptor_set_name.c_str(), O_RDONLY | O_BINARY);
  } while (fd < 0 && errno == EINTR);
  if (fd < 0) {
    std::cerr << descriptor_set_name << ": " << strerror(ENOENT) << std::endl;
    return nullptr;
  }

  FileDescriptorSet file_descriptor_set;
  bool parsed = file_descriptor_set.ParseFromFileDescriptor(fd);
  if (close(fd) != 0) {
    std::cerr << descriptor_set_name << ": close: " << strerror(errno)
              << std::endl;
    return nullptr;
  }

  if (!parsed) {
    std::cerr << descriptor_set_name << ": Unable to parse." << std::endl;
    return nullptr;
  }

  std::unique_ptr<SimpleDescriptorDatabase> database{
      new SimpleDescriptorDatabase()};

  for (int j = 0; j < file_descriptor_set.file_size(); j++) {
    FileDescriptorProto previously_added_file_descriptor_proto;
    if (database->FindFileByName(file_descriptor_set.file(j).name(),
                                 &previously_added_file_descriptor_proto)) {
      // already present - skip
      continue;
    }
    if (!database->Add(file_descriptor_set.file(j))) {
      return nullptr;
    }
  }
  return database;
}